

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_GateToType(Abc_Obj_t *pObj)

{
  char cVar1;
  int iVar2;
  char *__s1;
  
  __s1 = Mio_GateReadName((Mio_Gate_t *)(pObj->field_5).pData);
  cVar1 = *__s1;
  if (cVar1 == 'a') {
    if ((__s1[1] == 'n') && (__s1[2] == 'd')) {
      return 0xd;
    }
  }
  else if (cVar1 == 'i') {
    if ((__s1[1] == 'n') && (__s1[2] == 'v')) {
      return 0xc;
    }
  }
  else if (((cVar1 == 'b') && (__s1[1] == 'u')) && (__s1[2] == 'f')) {
    return 0xb;
  }
  iVar2 = strncmp(__s1,"nand",4);
  if (iVar2 == 0) {
    iVar2 = 0xe;
  }
  else {
    if (cVar1 == 'o') {
      if (__s1[1] == 'r') {
        return 0xf;
      }
    }
    else if (cVar1 == 'x') {
      if ((__s1[1] == 'o') && (__s1[2] == 'r')) {
        return 0x11;
      }
    }
    else if (((cVar1 == 'n') && (__s1[1] == 'o')) && (__s1[2] == 'r')) {
      return 0x10;
    }
    iVar2 = strncmp(__s1,"xnor",4);
    if (iVar2 == 0) {
      iVar2 = 0x12;
    }
    else {
      iVar2 = strncmp(__s1,"zero",4);
      if (iVar2 == 0) {
        iVar2 = 7;
      }
      else {
        if (((cVar1 != 'o') || (__s1[1] != 'n')) || (__s1[2] != 'e')) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                        ,0xc2a,"int Abc_GateToType(Abc_Obj_t *)");
        }
        iVar2 = 8;
      }
    }
  }
  return iVar2;
}

Assistant:

int Abc_GateToType( Abc_Obj_t * pObj )
{
    char * pGateName = Mio_GateReadName((Mio_Gate_t *)pObj->pData);
    if ( !strncmp(pGateName, "buf",  3) )  return ABC_OPER_BIT_BUF;
    if ( !strncmp(pGateName, "inv",  3) )  return ABC_OPER_BIT_INV;
    if ( !strncmp(pGateName, "and",  3) )  return ABC_OPER_BIT_AND;
    if ( !strncmp(pGateName, "nand", 4) )  return ABC_OPER_BIT_NAND;
    if ( !strncmp(pGateName, "or",   2) )  return ABC_OPER_BIT_OR;
    if ( !strncmp(pGateName, "nor",  3) )  return ABC_OPER_BIT_NOR;
    if ( !strncmp(pGateName, "xor",  3) )  return ABC_OPER_BIT_XOR;
    if ( !strncmp(pGateName, "xnor", 4) )  return ABC_OPER_BIT_NXOR;
    if ( !strncmp(pGateName, "zero", 4) )  return ABC_OPER_CONST_F;
    if ( !strncmp(pGateName, "one",  3) )  return ABC_OPER_CONST_T;
    assert( 0 );
    return -1;
}